

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

QDebug operator<<(QDebug *dbg,QDockAreaLayoutItem *item)

{
  QDockWidget *dockWidget_00;
  QDockWidget *pQVar1;
  QDebug *pQVar2;
  QDebug *in_RDX;
  QList<QDockAreaLayoutItem> *in_RSI;
  QDockWidgetGroupWindow *in_RDI;
  long in_FS_OFFSET;
  QDockWidgetGroupWindow *groupWindow;
  QDockWidget *dockWidget;
  QWidget *widget;
  QDebugStateSaver saver;
  QDebug *in_stack_ffffffffffffff38;
  QDockWidgetGroupWindow *this;
  QDockWidgetGroupWindow *in_stack_ffffffffffffff58;
  QDebug in_stack_ffffffffffffff88;
  QDebug local_70;
  QDebug local_68;
  QDebug local_60 [3];
  QWidget *in_stack_ffffffffffffffb8;
  QDebug in_stack_ffffffffffffffc0;
  QDebug local_38;
  QDebug local_30;
  QDebug local_28;
  QDebug local_20;
  QDebug local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  this = in_RDI;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_10,(QDebug *)in_RSI);
  QDebug::nospace((QDebug *)in_RSI);
  QDebug::operator<<((QDebug *)in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff88.stream);
  QDebug::operator<<((QDebug *)in_RDI,in_stack_ffffffffffffff38);
  QDebug::operator<<((QDebug *)in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff88.stream);
  if (in_RDX->stream == (Stream *)0x0) {
    if (in_RDX[1].stream == (Stream *)0x0) {
      if (in_RDX[2].stream != (Stream *)0x0) {
        QDebug::operator<<((QDebug *)in_stack_ffffffffffffff58,
                           (char *)in_stack_ffffffffffffff88.stream);
        QDebug::operator<<((QDebug *)in_RDI,in_stack_ffffffffffffff38);
        QDebug::operator<<((QDebug *)in_stack_ffffffffffffff58,
                           (char *)in_stack_ffffffffffffff88.stream);
      }
    }
    else {
      QDebug::operator<<((QDebug *)in_stack_ffffffffffffff58,
                         (char *)in_stack_ffffffffffffff88.stream);
      QDebug::operator<<((QDebug *)in_RDI,in_stack_ffffffffffffff38);
      pQVar2 = QDebug::operator<<((QDebug *)in_stack_ffffffffffffff58,
                                  (char *)in_stack_ffffffffffffff88.stream);
      QDebug::QDebug((QDebug *)&stack0xffffffffffffff88,pQVar2);
      operator<<((QDebug *)in_stack_ffffffffffffff58,in_RSI);
      QDebug::operator<<((QDebug *)in_stack_ffffffffffffff58,
                         (char *)in_stack_ffffffffffffff88.stream);
      QDebug::~QDebug(&local_70);
      QDebug::~QDebug((QDebug *)&stack0xffffffffffffff88);
    }
  }
  else {
    dockWidget_00 = (QDockWidget *)(**(code **)(*(long *)in_RDX->stream + 0x68))();
    pQVar1 = qobject_cast<QDockWidget*>((QObject *)0x56da1c);
    if (pQVar1 == (QDockWidget *)0x0) {
      in_stack_ffffffffffffff58 = qobject_cast<QDockWidgetGroupWindow*>((QObject *)0x56daa1);
      if (in_stack_ffffffffffffff58 == (QDockWidgetGroupWindow *)0x0) {
        pQVar2 = QDebug::operator<<((QDebug *)0x0,(char *)in_stack_ffffffffffffff88.stream);
        QDebug::QDebug(&local_68,pQVar2);
        operator<<((QDebug *)in_stack_ffffffffffffffc0.stream,in_stack_ffffffffffffffb8);
        QDebug::operator<<((QDebug *)in_stack_ffffffffffffff58,
                           (char *)in_stack_ffffffffffffff88.stream);
        QDebug::~QDebug(local_60);
        QDebug::~QDebug(&local_68);
      }
      else {
        pQVar2 = QDebug::operator<<((QDebug *)in_stack_ffffffffffffff58,
                                    (char *)in_stack_ffffffffffffff88.stream);
        QDebug::QDebug((QDebug *)&stack0xffffffffffffffc0,pQVar2);
        operator<<((QDebug *)in_stack_ffffffffffffffc0.stream,in_stack_ffffffffffffffb8);
        pQVar2 = QDebug::operator<<((QDebug *)in_stack_ffffffffffffff58,
                                    (char *)in_stack_ffffffffffffff88.stream);
        QDebug::QDebug(&local_30,pQVar2);
        QDockWidgetGroupWindow::dockWidgets(this);
        operator<<((QDebug *)in_stack_ffffffffffffff58,(QList<QDockWidget_*> *)in_RSI);
        QDebug::operator<<((QDebug *)in_stack_ffffffffffffff58,
                           (char *)in_stack_ffffffffffffff88.stream);
        QDebug::~QDebug(&local_28);
        QList<QDockWidget_*>::~QList((QList<QDockWidget_*> *)0x56db65);
        QDebug::~QDebug(&local_30);
        QDebug::~QDebug(&local_38);
        QDebug::~QDebug((QDebug *)&stack0xffffffffffffffc0);
      }
    }
    else {
      pQVar2 = QDebug::operator<<((QDebug *)in_stack_ffffffffffffff58,
                                  (char *)in_stack_ffffffffffffff88.stream);
      QDebug::QDebug(&local_20,pQVar2);
      operator<<(in_RDX,dockWidget_00);
      QDebug::operator<<((QDebug *)in_stack_ffffffffffffff58,
                         (char *)in_stack_ffffffffffffff88.stream);
      QDebug::~QDebug(&local_18);
      QDebug::~QDebug(&local_20);
    }
  }
  QDebug::operator<<((QDebug *)in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff88.stream);
  QDebug::QDebug((QDebug *)in_RDI,in_stack_ffffffffffffff38);
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QDebug)(Stream *)this;
}

Assistant:

QDebug operator<<(QDebug dbg, const QDockAreaLayoutItem &item)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace();
    dbg << "QDockAreaLayoutItem(" << static_cast<const void *>(&item) << "->";
    if (item.widgetItem) {
        QWidget *widget = item.widgetItem->widget();
        if (auto *dockWidget = qobject_cast<QDockWidget *>(widget)) {
            dbg << "widgetItem(" << dockWidget << ")";
        } else if (auto *groupWindow = qobject_cast<QDockWidgetGroupWindow *>(widget)) {
            dbg << "widgetItem(" << groupWindow << "->(" << groupWindow->dockWidgets() << "))";
        } else {
            dbg << "widgetItem(" << widget << ")";
        }
    } else if (item.subinfo) {
        dbg << "subInfo(" << item.subinfo << "->(" << item.subinfo->item_list << ")";
    } else if (item.placeHolderItem) {
        dbg << "placeHolderItem(" << item.placeHolderItem << ")";
    }
    dbg << ")";
    return dbg;
}